

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O1

void accumulate_suite::test_overfull(void)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  int iVar4;
  ulong uVar5;
  initializer_list<int> input;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_88;
  iterator_type local_78;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_88.parent = (view_pointer)0x160000000b;
  local_88.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  local_78.current = local_50.member.cap * 2;
  uVar5 = local_78.current - (local_50.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_88.current = (local_50.member.next - local_50.member.size) % local_78.current;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    local_78.current = local_78.current - 1 & local_50.member.next;
  }
  else {
    local_78.current = local_50.member.next % local_78.current;
  }
  local_88.parent = &local_50;
  local_78.parent = &local_50;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_78);
  iVar4 = 0;
  if (!bVar1) {
    iVar4 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      iVar4 = iVar4 + *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_88,&local_78);
    } while (!bVar1);
  }
  local_88.parent = (view_pointer)CONCAT44(local_88.parent._4_4_,iVar4);
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,0x6e);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","11 + 22 + 33 + 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1d,"void accumulate_suite::test_overfull()",&local_88,&local_78);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar3 = 0x37;
  local_78.current = local_50.member.cap * 2;
  uVar5 = local_78.current - (local_50.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_88.current = local_78.current - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_88.current = (local_50.member.next - local_50.member.size) % local_78.current;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    local_78.current = local_78.current - 1 & local_50.member.next;
  }
  else {
    local_78.current = local_50.member.next % local_78.current;
  }
  local_88.parent = &local_50;
  local_78.parent = &local_50;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_78);
  iVar4 = 0;
  if (!bVar1) {
    iVar4 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      iVar4 = iVar4 + *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_88,&local_78);
    } while (!bVar1);
  }
  local_88.parent = (view_pointer)CONCAT44(local_88.parent._4_4_,iVar4);
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,0x9a);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","22 + 33 + 44 + 55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1f,"void accumulate_suite::test_overfull()",&local_88,&local_78);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 11 + 22 + 33 + 44);
    span.push_back(55);
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 22 + 33 + 44 + 55);
}